

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O1

void capnp::_::
     checkList<capnp::List<double,_(capnp::Kind)0>::Builder,_capnp::List<double,_(capnp::Kind)0>,_false>
               (Builder reader,initializer_list<double> expected)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  Exception *pEVar5;
  double dVar6;
  Fault f;
  double local_40;
  ListElementCount local_34;
  
  dVar2 = (double)expected._M_len;
  if ((double)(ulong)reader.builder.elementCount == dVar2) {
    if (dVar2 != 0.0) {
      dVar1 = 0.0;
      dVar3 = 4.94065645841247e-324;
      do {
        f.exception = (Exception *)expected._M_array[(long)dVar1];
        local_40 = *(double *)(reader.builder.ptr + ((long)dVar1 * (ulong)reader.builder.step >> 3))
        ;
        if ((local_40 != (double)f.exception) || (NAN(local_40) || NAN((double)f.exception))) {
          dVar6 = local_40 - (double)f.exception;
          dVar1 = -dVar6;
          if (-dVar6 <= dVar6) {
            dVar1 = dVar6;
          }
          dVar6 = -local_40;
          if (-local_40 <= local_40) {
            dVar6 = local_40;
          }
          pEVar5 = (Exception *)-(double)f.exception;
          if (-(double)f.exception <= (double)f.exception) {
            pEVar5 = f.exception;
          }
          if ((((double)pEVar5 + dVar6) * 1e-12 <= dVar1) && (kj::_::Debug::minSeverity < 3)) {
            kj::_::Debug::log<char_const(&)[50],double&,double&>
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.h"
                       ,0x7c,ERROR,
                       "\"failed: expected \" \"::kj::_::doubleAlmostEqual(b, a)\", b, a",
                       (char (*) [50])"failed: expected ::kj::_::doubleAlmostEqual(b, a)",&local_40,
                       (double *)&f);
          }
        }
        bVar4 = (ulong)dVar3 < (ulong)dVar2;
        dVar1 = dVar3;
        dVar3 = (double)(ulong)(SUB84(dVar3,0) + 1);
      } while (bVar4);
    }
    return;
  }
  local_34 = reader.builder.elementCount;
  local_40 = dVar2;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_long,unsigned_int>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.h"
             ,0x89,FAILED,"(expected.size()) == (reader.size())","expected.size(), reader.size()",
             (unsigned_long *)&local_40,&local_34);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void checkList(T reader, std::initializer_list<decltype(typename L::Reader()[0])> expected) {
  ASSERT_EQ(expected.size(), reader.size());
  for (uint i = 0; i < expected.size(); i++) {
    checkElement<decltype(typename L::Reader()[0])>(expected.begin()[i], reader[i]);
  }
}